

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O3

optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
* getObject(optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
            *__return_storage_ptr__,Document *value,string *key)

{
  Number NVar1;
  Number in_RAX;
  MemberIterator itr;
  undefined8 local_18;
  
  local_18 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe8,(Ch *)value);
  if ((value->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidjson/include/rapidjson/document.h"
                  ,0x48c,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (local_18 !=
      (ulong)(value->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ).data_.s.length * 0x20 +
      ((ulong)(value->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ).data_.s.str & 0xffffffffffff)) {
    if (*(short *)(local_18 + 0x1e) == 3) {
      NVar1 = *(Number *)(local_18 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->value).data_ + 6) =
           *(undefined8 *)(local_18 + 0x16);
      (__return_storage_ptr__->value).data_.n = NVar1;
      *(undefined8 *)(local_18 + 0x10) = 0;
      *(undefined8 *)(local_18 + 0x18) = 0;
      *(undefined2 *)(local_18 + 0x1e) = 3;
      (__return_storage_ptr__->value).data_.f.flags = 3;
      __return_storage_ptr__->is_some = true;
      return __return_storage_ptr__;
    }
    if (*(short *)(local_18 + 0x1e) != 0) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidjson/include/rapidjson/document.h"
                    ,0x608,
                    "Object rapidjson::GenericValue<rapidjson::UTF8<>>::GetObject() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  (__return_storage_ptr__->value).data_.n = (Number)0x0;
  (__return_storage_ptr__->value).data_.s.str = (Ch *)0x0;
  __return_storage_ptr__->is_some = false;
  return __return_storage_ptr__;
}

Assistant:

optional<Value> getObject (Document &value, const string &key) {
    auto itr = value.FindMember(key.c_str());
    if (itr == value.MemberEnd() || itr->value.IsNull()) {
        return {};
    }
    return { itr->value.GetObject() };
}